

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall
cs_impl::any::holder<cs::object_method>::holder<cs_impl::any_const&,cs_impl::any&>
          (holder<cs::object_method> *this,any *args,any *args_1)

{
  proxy *ppVar1;
  proxy *ppVar2;
  any local_18;
  any local_10;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_00328f00;
  ppVar1 = args->mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  ppVar2 = args_1->mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  (this->mDat).object.mDat = ppVar1;
  local_10.mDat = (proxy *)0x0;
  (this->mDat).callable.mDat = ppVar2;
  local_18.mDat = (proxy *)0x0;
  (this->mDat).is_request_fold = false;
  recycle(&local_18);
  recycle(&local_10);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}